

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigCanon.c
# Opt level: O3

Fraig_Node_t * Fraig_NodeAndCanon(Fraig_Man_t *pMan,Fraig_Node_t *p1,Fraig_Node_t *p2)

{
  int iVar1;
  uint uVar2;
  Fraig_Node_t *pFVar3;
  Fraig_Node_t *pNodeNew;
  Fraig_Node_t *local_20;
  
  if (p1 != p2) {
    if ((Fraig_Node_t *)((ulong)p2 ^ 1) == p1) {
      p1 = (Fraig_Node_t *)((ulong)pMan->pConst1 ^ 1);
    }
    else {
      iVar1 = Fraig_NodeIsConst(p1);
      if (iVar1 == 0) {
        iVar1 = Fraig_NodeIsConst(p2);
        if (iVar1 == 0) {
          iVar1 = Fraig_HashTableLookupS(pMan,p1,p2,&local_20);
          if (iVar1 != 0) {
            if (pMan->fFuncRed == 0) {
              return local_20;
            }
            pFVar3 = ((Fraig_Node_t *)((ulong)local_20 & 0xfffffffffffffffe))->pRepr;
            if (pFVar3 == (Fraig_Node_t *)0x0) {
              return local_20;
            }
            uVar2 = Fraig_NodeComparePhase
                              ((Fraig_Node_t *)((ulong)local_20 & 0xfffffffffffffffe),pFVar3);
            return (Fraig_Node_t *)((long)(int)(uVar2 ^ (uint)local_20 & 1) ^ (ulong)pFVar3);
          }
          if (pMan->fFuncRed == 0) {
            return local_20;
          }
          if ((*(uint *)&local_20->field_0x18 < 0x1000) ||
             (*(uint *)&local_20->field_0x18 >> 0xc == pMan->nWordsRand << 5)) {
            pMan->nSatZeros = pMan->nSatZeros + 1;
            if (pMan->fDoSparse == 0) {
              return local_20;
            }
            pFVar3 = Fraig_HashTableLookupF0(pMan,local_20);
          }
          else {
            pFVar3 = Fraig_HashTableLookupF(pMan,local_20);
          }
          if (pFVar3 == (Fraig_Node_t *)0x0) {
            return local_20;
          }
          if (pFVar3->pRepr != (Fraig_Node_t *)0x0) {
            __assert_fail("pNodeOld->pRepr == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fraig/fraigCanon.c"
                          ,0xaa,
                          "Fraig_Node_t *Fraig_NodeAndCanon(Fraig_Man_t *, Fraig_Node_t *, Fraig_Node_t *)"
                         );
          }
          if (((pMan->nInspLimit == 0) ||
              (iVar1 = Fraig_ManReadInspects(pMan), (long)iVar1 < pMan->nInspLimit)) &&
             (iVar1 = Fraig_NodeIsEquivalent(pMan,pFVar3,local_20,pMan->nBTLimit,1000000),
             iVar1 != 0)) {
            if ((pMan->fChoicing != 0) && (iVar1 = Fraig_CheckTfi(pMan,pFVar3,local_20), iVar1 == 0)
               ) {
              local_20->pNextE = pFVar3->pNextE;
              pFVar3->pNextE = local_20;
            }
            local_20->pRepr = pFVar3;
            iVar1 = Fraig_NodeComparePhase(pFVar3,local_20);
            return (Fraig_Node_t *)((long)iVar1 ^ (ulong)pFVar3);
          }
          if ((*(uint *)&local_20->field_0x18 < 0x1000) ||
             (*(uint *)&local_20->field_0x18 >> 0xc == pMan->nWordsRand << 5)) {
            if (pMan->fDoSparse == 0) {
              __assert_fail("pMan->fDoSparse",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fraig/fraigCanon.c"
                            ,0xc9,
                            "Fraig_Node_t *Fraig_NodeAndCanon(Fraig_Man_t *, Fraig_Node_t *, Fraig_Node_t *)"
                           );
            }
            Fraig_HashTableLookupF0(pMan,local_20);
          }
          else {
            local_20->pNextD = pFVar3->pNextD;
            pFVar3->pNextD = local_20;
          }
          if (local_20->pRepr == (Fraig_Node_t *)0x0) {
            return local_20;
          }
          __assert_fail("pNodeNew->pRepr == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fraig/fraigCanon.c"
                        ,0xd4,
                        "Fraig_Node_t *Fraig_NodeAndCanon(Fraig_Man_t *, Fraig_Node_t *, Fraig_Node_t *)"
                       );
        }
        pFVar3 = pMan->pConst1;
        if (pFVar3 == p2) {
          return p1;
        }
      }
      else {
        pFVar3 = pMan->pConst1;
        if (pFVar3 == p1) {
          return p2;
        }
      }
      p1 = (Fraig_Node_t *)((ulong)pFVar3 ^ 1);
    }
  }
  return p1;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [The internal AND operation for the two FRAIG nodes.]

  Description [This procedure is the core of the FRAIG package, because
  it performs the two-step canonicization of FRAIG nodes. The first step
  involves the lookup in the structural hash table (which hashes two ANDs 
  into a node that has them as fanins, if such a node exists). If the node 
  is not found in the structural hash table, an attempt is made to find a 
  functionally equivalent node in another hash table (which hashes the 
  simulation info into the nodes, which has this simulation info). Some 
  tricks used on the way are described in the comments to the code and
  in the paper "FRAIGs: Functionally reduced AND-INV graphs".]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Fraig_Node_t * Fraig_NodeAndCanon( Fraig_Man_t * pMan, Fraig_Node_t * p1, Fraig_Node_t * p2 )
{
    Fraig_Node_t * pNodeNew, * pNodeOld, * pNodeRepr;
    int fUseSatCheck;
//    int RetValue;

    // check for trivial cases
    if ( p1 == p2 )
        return p1;
    if ( p1 == Fraig_Not(p2) )
        return Fraig_Not(pMan->pConst1);
    if ( Fraig_NodeIsConst(p1) )
    {
        if ( p1 == pMan->pConst1 )
            return p2;
        return Fraig_Not(pMan->pConst1);
    }
    if ( Fraig_NodeIsConst(p2) )
    {
        if ( p2 == pMan->pConst1 )
            return p1;
        return Fraig_Not(pMan->pConst1);
    }
/*
    // check for less trivial cases
    if ( Fraig_IsComplement(p1) )
    {
        if ( RetValue = Fraig_NodeIsInSupergate( Fraig_Regular(p1), p2 ) )
        {
            if ( RetValue == -1 )
                pMan->nImplies0++;
            else
                pMan->nImplies1++;

            if ( RetValue == -1 )
                return p2;
        }
    }
    else
    {
        if ( RetValue = Fraig_NodeIsInSupergate( p1, p2 ) )
        {
            if ( RetValue == 1 )
                pMan->nSimplifies1++;
            else
                pMan->nSimplifies0++;

            if ( RetValue == 1 )
                return p1;
            return Fraig_Not(pMan->pConst1);
        }
    }
 
    if ( Fraig_IsComplement(p2) )
    {
        if ( RetValue = Fraig_NodeIsInSupergate( Fraig_Regular(p2), p1 ) )
        {
            if ( RetValue == -1 )
                pMan->nImplies0++;
            else
                pMan->nImplies1++;

            if ( RetValue == -1 )
                return p1;
        }
    }
    else
    {
        if ( RetValue = Fraig_NodeIsInSupergate( p2, p1 ) )
        {
            if ( RetValue == 1 )
                pMan->nSimplifies1++;
            else
                pMan->nSimplifies0++;

            if ( RetValue == 1 )
                return p2;
            return Fraig_Not(pMan->pConst1);
        }
    }
*/
    // perform level-one structural hashing
    if ( Fraig_HashTableLookupS( pMan, p1, p2, &pNodeNew ) ) // the node with these children is found
    {
        // if the existent node is part of the cone of unused logic
        // (that is logic feeding the node which is equivalent to the given node)
        // return the canonical representative of this node
        // determine the phase of the given node, with respect to its canonical form
        pNodeRepr = Fraig_Regular(pNodeNew)->pRepr;
        if ( pMan->fFuncRed && pNodeRepr )
            return Fraig_NotCond( pNodeRepr, Fraig_IsComplement(pNodeNew) ^ Fraig_NodeComparePhase(Fraig_Regular(pNodeNew), pNodeRepr) );
        // otherwise, the node is itself a canonical representative, return it
        return pNodeNew;
    }
    // the same node is not found, but the new one is created

    // if one level hashing is requested (without functionality hashing), return
    if ( !pMan->fFuncRed )
        return pNodeNew;

    // check if the new node is unique using the simulation info
    if ( pNodeNew->nOnes == 0 || pNodeNew->nOnes == (unsigned)pMan->nWordsRand * 32 )
    {
        pMan->nSatZeros++;
        if ( !pMan->fDoSparse ) // if we do not do sparse functions, skip
            return pNodeNew;
        // check the sparse function simulation hash table
        pNodeOld = Fraig_HashTableLookupF0( pMan, pNodeNew );
        if ( pNodeOld == NULL ) // the node is unique (it is added to the table)
            return pNodeNew;
    }
    else
    {
        // check the simulation hash table
        pNodeOld = Fraig_HashTableLookupF( pMan, pNodeNew );
        if ( pNodeOld == NULL ) // the node is unique
            return pNodeNew;
    }
    assert( pNodeOld->pRepr == 0 );
    // there is another node which looks the same according to simulation

    // use SAT to resolve the ambiguity
    fUseSatCheck = (pMan->nInspLimit == 0 || Fraig_ManReadInspects(pMan) < pMan->nInspLimit); 
    if ( fUseSatCheck && Fraig_NodeIsEquivalent( pMan, pNodeOld, pNodeNew, pMan->nBTLimit, 1000000 ) )
    {
        // set the node to be equivalent with this node
        // to prevent loops, only set if the old node is not in the TFI of the new node
        // the loop may happen in the following case: suppose 
        // NodeC = AND(NodeA, NodeB) and at the same time NodeA => NodeB
        // in this case, NodeA and NodeC are functionally equivalent
        // however, NodeA is a fanin of node NodeC (this leads to the loop)
        // add the node to the list of equivalent nodes or dereference it
        if ( pMan->fChoicing && !Fraig_CheckTfi( pMan, pNodeOld, pNodeNew ) )
        { 
            // if the old node is not in the TFI of the new node and choicing 
            // is enabled, add the new node to the list of equivalent ones
            pNodeNew->pNextE = pNodeOld->pNextE;
            pNodeOld->pNextE = pNodeNew;
        }
        // set the canonical representative of this node
        pNodeNew->pRepr = pNodeOld;
        // return the equivalent node
        return Fraig_NotCond( pNodeOld, Fraig_NodeComparePhase(pNodeOld, pNodeNew) );
    }

    // now we add another member to this simulation class
    if ( pNodeNew->nOnes == 0 || pNodeNew->nOnes == (unsigned)pMan->nWordsRand * 32 )
    {
        Fraig_Node_t * pNodeTemp;
        assert( pMan->fDoSparse );
        pNodeTemp = Fraig_HashTableLookupF0( pMan, pNodeNew );
//        assert( pNodeTemp == NULL );
//        Fraig_HashTableInsertF0( pMan, pNodeNew );
    }
    else
    {
        pNodeNew->pNextD = pNodeOld->pNextD;
        pNodeOld->pNextD = pNodeNew;
    }
    // return the new node
    assert( pNodeNew->pRepr == 0 );
    return pNodeNew;
}